

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O0

void __thiscall streams_tests::bitstream_reader_writer::test_method(bitstream_reader_writer *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  failure *ex;
  BitStreamReader<DataStream> bit_reader;
  uint16_t serialized_int2;
  uint32_t serialized_int1;
  DataStream data_copy;
  BitStreamWriter<DataStream> bit_writer;
  DataStream data;
  char *in_stack_fffffffffffff928;
  DataStream *in_stack_fffffffffffff930;
  char *in_stack_fffffffffffff938;
  uint64_t in_stack_fffffffffffff948;
  undefined6 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff956;
  undefined1 in_stack_fffffffffffff957;
  undefined4 in_stack_fffffffffffff958;
  int in_stack_fffffffffffff95c;
  BitStreamReader<DataStream> *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  const_string local_4a8;
  lazy_ostream local_498 [2];
  assertion_result local_478 [3];
  DataStream local_41c [3];
  DataStream local_3bc [3];
  DataStream local_35c [3];
  DataStream local_2fc [3];
  DataStream local_29c [3];
  DataStream local_23c [3];
  DataStream local_1dc [3];
  DataStream local_17c [3];
  DataStream local_10a [2];
  undefined1 local_b6 [2];
  DataStream local_b4 [2];
  undefined1 local_5c [52];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff928);
  BitStreamWriter<DataStream>::BitStreamWriter
            ((BitStreamWriter<DataStream> *)in_stack_fffffffffffff928,(DataStream *)0xb02d01);
  BitStreamWriter<DataStream>::Write
            ((BitStreamWriter<DataStream> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             in_stack_fffffffffffff948,in_stack_fffffffffffff95c);
  BitStreamWriter<DataStream>::Write
            ((BitStreamWriter<DataStream> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             in_stack_fffffffffffff948,in_stack_fffffffffffff95c);
  BitStreamWriter<DataStream>::Write
            ((BitStreamWriter<DataStream> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             in_stack_fffffffffffff948,in_stack_fffffffffffff95c);
  BitStreamWriter<DataStream>::Write
            ((BitStreamWriter<DataStream> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             in_stack_fffffffffffff948,in_stack_fffffffffffff95c);
  BitStreamWriter<DataStream>::Write
            ((BitStreamWriter<DataStream> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             in_stack_fffffffffffff948,in_stack_fffffffffffff95c);
  BitStreamWriter<DataStream>::Write
            ((BitStreamWriter<DataStream> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             in_stack_fffffffffffff948,in_stack_fffffffffffff95c);
  BitStreamWriter<DataStream>::Write
            ((BitStreamWriter<DataStream> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             in_stack_fffffffffffff948,in_stack_fffffffffffff95c);
  BitStreamWriter<DataStream>::Write
            ((BitStreamWriter<DataStream> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             in_stack_fffffffffffff948,in_stack_fffffffffffff95c);
  BitStreamWriter<DataStream>::Flush((BitStreamWriter<DataStream> *)in_stack_fffffffffffff928);
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffff938,(uint *)in_stack_fffffffffffff930);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_b4[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7700c35a;
    in_stack_fffffffffffff938 = "uint32_t{0x7700C35A}";
    in_stack_fffffffffffff930 = local_b4;
    in_stack_fffffffffffff928 = "serialized_int1";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              ((undefined1 *)
               ((long)&local_b4[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_b4[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0xcc,1,2,local_5c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffff938,(unsigned_short *)in_stack_fffffffffffff930);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_10a[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_2_ = 0x1072;
    in_stack_fffffffffffff938 = "uint16_t{0x1072}";
    in_stack_fffffffffffff930 = local_10a;
    in_stack_fffffffffffff928 = "serialized_int2";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
              ((undefined1 *)
               ((long)&local_10a[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 2),
               (undefined1 *)
               ((long)&local_10a[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 2),0xcf,1,2,local_b6);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  BitStreamReader<DataStream>::BitStreamReader
            ((BitStreamReader<DataStream> *)in_stack_fffffffffffff928,(DataStream *)0xb03094);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_17c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._4_8_ =
         BitStreamReader<DataStream>::Read(in_stack_fffffffffffff960,in_stack_fffffffffffff96c);
    local_17c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    in_stack_fffffffffffff938 = "0U";
    in_stack_fffffffffffff930 = local_17c;
    in_stack_fffffffffffff928 = "bit_reader.Read(1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_17c[0].m_read_pos + 4),
               (undefined1 *)
               ((long)&local_17c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0xd2,1,2,
               (undefined1 *)
               ((long)&local_17c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_1dc[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._4_8_ =
         BitStreamReader<DataStream>::Read(in_stack_fffffffffffff960,in_stack_fffffffffffff96c);
    local_1dc[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 2;
    in_stack_fffffffffffff938 = "2U";
    in_stack_fffffffffffff930 = local_1dc;
    in_stack_fffffffffffff928 = "bit_reader.Read(2)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_1dc[0].m_read_pos + 4),
               (undefined1 *)
               ((long)&local_1dc[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0xd3,1,2,
               (undefined1 *)
               ((long)&local_1dc[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_23c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._4_8_ =
         BitStreamReader<DataStream>::Read(in_stack_fffffffffffff960,in_stack_fffffffffffff96c);
    local_23c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 6;
    in_stack_fffffffffffff938 = "6U";
    in_stack_fffffffffffff930 = local_23c;
    in_stack_fffffffffffff928 = "bit_reader.Read(3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_23c[0].m_read_pos + 4),
               (undefined1 *)
               ((long)&local_23c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0xd4,1,2,
               (undefined1 *)
               ((long)&local_23c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_29c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._4_8_ =
         BitStreamReader<DataStream>::Read(in_stack_fffffffffffff960,in_stack_fffffffffffff96c);
    local_29c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0xb;
    in_stack_fffffffffffff938 = "11U";
    in_stack_fffffffffffff930 = local_29c;
    in_stack_fffffffffffff928 = "bit_reader.Read(4)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_29c[0].m_read_pos + 4),
               (undefined1 *)
               ((long)&local_29c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0xd5,1,2,
               (undefined1 *)
               ((long)&local_29c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_2fc[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._4_8_ =
         BitStreamReader<DataStream>::Read(in_stack_fffffffffffff960,in_stack_fffffffffffff96c);
    local_2fc[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 1;
    in_stack_fffffffffffff938 = "1U";
    in_stack_fffffffffffff930 = local_2fc;
    in_stack_fffffffffffff928 = "bit_reader.Read(5)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_2fc[0].m_read_pos + 4),
               (undefined1 *)
               ((long)&local_2fc[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0xd6,1,2,
               (undefined1 *)
               ((long)&local_2fc[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_35c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._4_8_ =
         BitStreamReader<DataStream>::Read(in_stack_fffffffffffff960,in_stack_fffffffffffff96c);
    local_35c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x20;
    in_stack_fffffffffffff938 = "32U";
    in_stack_fffffffffffff930 = local_35c;
    in_stack_fffffffffffff928 = "bit_reader.Read(6)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_35c[0].m_read_pos + 4),
               (undefined1 *)
               ((long)&local_35c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0xd7,1,2,
               (undefined1 *)
               ((long)&local_35c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_3bc[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._4_8_ =
         BitStreamReader<DataStream>::Read(in_stack_fffffffffffff960,in_stack_fffffffffffff96c);
    local_3bc[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 7;
    in_stack_fffffffffffff938 = "7U";
    in_stack_fffffffffffff930 = local_3bc;
    in_stack_fffffffffffff928 = "bit_reader.Read(7)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_3bc[0].m_read_pos + 4),
               (undefined1 *)
               ((long)&local_3bc[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0xd8,1,2,
               (undefined1 *)
               ((long)&local_3bc[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_41c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._4_8_ =
         BitStreamReader<DataStream>::Read(in_stack_fffffffffffff960,in_stack_fffffffffffff96c);
    local_41c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7721;
    in_stack_fffffffffffff938 = "30497U";
    in_stack_fffffffffffff930 = local_41c;
    in_stack_fffffffffffff928 = "bit_reader.Read(16)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_41c[0].m_read_pos + 4),
               (undefined1 *)
               ((long)&local_41c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0xd9,1,2,
               (undefined1 *)
               ((long)&local_41c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (const_string *)in_stack_fffffffffffff960,
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    BitStreamReader<DataStream>::Read(in_stack_fffffffffffff960,in_stack_fffffffffffff96c);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
                 (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                 (const_string *)in_stack_fffffffffffff960,
                 CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                 (const_string *)
                 CONCAT17(in_stack_fffffffffffff957,
                          CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff938,
                 SUB81((ulong)in_stack_fffffffffffff930 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff930,(char (*) [57])in_stack_fffffffffffff928)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
                 (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
      in_stack_fffffffffffff928 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_478,local_498,&local_4a8,0xda,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_fffffffffffff928);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff928);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffff96c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff96c);
    } while (bVar1);
    in_stack_fffffffffffff956 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff956);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff928);
  BitStreamWriter<DataStream>::~BitStreamWriter
            ((BitStreamWriter<DataStream> *)in_stack_fffffffffffff928);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff928);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bitstream_reader_writer)
{
    DataStream data{};

    BitStreamWriter bit_writer{data};
    bit_writer.Write(0, 1);
    bit_writer.Write(2, 2);
    bit_writer.Write(6, 3);
    bit_writer.Write(11, 4);
    bit_writer.Write(1, 5);
    bit_writer.Write(32, 6);
    bit_writer.Write(7, 7);
    bit_writer.Write(30497, 16);
    bit_writer.Flush();

    DataStream data_copy{data};
    uint32_t serialized_int1;
    data >> serialized_int1;
    BOOST_CHECK_EQUAL(serialized_int1, uint32_t{0x7700C35A}); // NOTE: Serialized as LE
    uint16_t serialized_int2;
    data >> serialized_int2;
    BOOST_CHECK_EQUAL(serialized_int2, uint16_t{0x1072}); // NOTE: Serialized as LE

    BitStreamReader bit_reader{data_copy};
    BOOST_CHECK_EQUAL(bit_reader.Read(1), 0U);
    BOOST_CHECK_EQUAL(bit_reader.Read(2), 2U);
    BOOST_CHECK_EQUAL(bit_reader.Read(3), 6U);
    BOOST_CHECK_EQUAL(bit_reader.Read(4), 11U);
    BOOST_CHECK_EQUAL(bit_reader.Read(5), 1U);
    BOOST_CHECK_EQUAL(bit_reader.Read(6), 32U);
    BOOST_CHECK_EQUAL(bit_reader.Read(7), 7U);
    BOOST_CHECK_EQUAL(bit_reader.Read(16), 30497U);
    BOOST_CHECK_THROW(bit_reader.Read(8), std::ios_base::failure);
}